

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_functions.h
# Opt level: O1

void TestGMAA(Arguments *args)

{
  double dVar1;
  BGIP_SolverCreatorInterface *pBVar2;
  time_t tVar3;
  ostream *poVar4;
  PlanningUnitMADPDiscreteParameters params;
  QMDP qmdp;
  QBG qbg;
  QPOMDP qpomdp;
  GMAA_kGMAA gmaa_em;
  ProblemDecTiger pdt;
  GMAA_MAAstarClassic gmaa_maa;
  GMAA_MAAstarClassic gmaa_maa3;
  PlanningUnitMADPDiscreteParameters local_1071 [9];
  long local_1068 [14];
  QBG local_ff8 [96];
  QPOMDP local_f98 [96];
  GMAA_kGMAA local_f38 [32];
  uint local_f18;
  GeneralizedMAAStarPlanner local_c00 [40];
  double local_bd8;
  QPOMDP *local_b00;
  ProblemDecTiger local_af0;
  GMAA_MAAstarClassic local_8a0 [32];
  uint local_880;
  GeneralizedMAAStarPlanner local_568 [40];
  double local_540;
  long local_468;
  GMAA_MAAstarClassic local_460 [824];
  GeneralizedMAAStarPlanner local_128 [40];
  double local_100;
  QBG *local_28;
  
  ProblemDecTiger::ProblemDecTiger(&local_af0);
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_1071);
  PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(local_1071,0));
  pBVar2 = (BGIP_SolverCreatorInterface *)operator_new(0x28);
  pBVar2->_vptr_BGIP_SolverCreatorInterface =
       (_func_int **)&PTR__BGIP_SolverCreatorInterface_00121ae8;
  pBVar2[1]._vptr_BGIP_SolverCreatorInterface = (_func_int **)0xa;
  *(undefined4 *)&pBVar2[2]._vptr_BGIP_SolverCreatorInterface = 0;
  pBVar2[3]._vptr_BGIP_SolverCreatorInterface = (_func_int **)0x1;
  pBVar2[4]._vptr_BGIP_SolverCreatorInterface = (_func_int **)0x0;
  GMAA_kGMAA::GMAA_kGMAA
            (local_f38,pBVar2,2,
             (DecPOMDPDiscreteInterface *)
             (&local_af0.super_DecPOMDPDiscrete + *(long *)(local_af0._0_8_ + -0x50)),local_1071,1);
  QMDP::QMDP((QMDP *)local_1068,(PlanningUnitDecPOMDPDiscrete *)local_f38,false);
  QMDP::Compute();
  local_b00 = (QPOMDP *)((long)local_1068 + *(long *)(local_1068[0] + -0x98));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---------------------------------------",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-gmaa_em.Print()---------------------",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  PlanningUnitMADPDiscrete::Print();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---------------------------------------",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-gmaa_em.Plan()- QMDP - horizon=2------",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  tVar3 = time((time_t *)0x0);
  local_f18 = (uint)tVar3;
  srand(local_f18);
  GeneralizedMAAStarPlanner::Plan();
  dVar1 = local_bd8;
  if (args->testMode == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\napprox. value=",0xf)
    ;
    poVar4 = std::ostream::_M_insert<double>(dVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  QPOMDP::QPOMDP(local_f98,(PlanningUnitDecPOMDPDiscrete *)local_f38);
  QFunctionJAOHTree::Compute();
  local_b00 = local_f98;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---------------------------------------",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-gmaa_em.Plan()- QPOMDP - horizon=2----",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  GeneralizedMAAStarPlanner::Plan();
  dVar1 = local_bd8;
  if (args->testMode == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\napprox. value=",0xf)
    ;
    poVar4 = std::ostream::_M_insert<double>(dVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  QBG::QBG(local_ff8,(PlanningUnitDecPOMDPDiscrete *)local_f38);
  QFunctionJAOHTree::Compute();
  local_b00 = (QPOMDP *)local_ff8;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---------------------------------------",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-gmaa_em.Plan()- QBG - horizon=2----",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  GeneralizedMAAStarPlanner::Plan();
  if (args->testMode == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\napprox. value=",0xf)
    ;
    poVar4 = std::ostream::_M_insert<double>(local_bd8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if (args->testMode == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"press <enter> to continue...",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::istream::get();
  }
  GMAA_MAAstarClassic::GMAA_MAAstarClassic
            (local_8a0,2,
             (DecPOMDPDiscreteInterface *)
             (&local_af0.super_DecPOMDPDiscrete + *(long *)(local_af0._0_8_ + -0x50)),local_1071,0);
  QMDP::SetPU((PlanningUnitDecPOMDPDiscrete *)local_1068);
  QMDP::Compute();
  local_468 = (long)local_1068 + *(long *)(local_1068[0] + -0x98);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---------------------------------------",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-gmaa_maa.Print()---------------------",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  PlanningUnitMADPDiscrete::Print();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---------------------------------------",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-gmaa_maa.Plan()- QMDP - horizon=2----------------",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  tVar3 = time((time_t *)0x0);
  local_880 = (uint)tVar3;
  srand(local_880);
  if (args->testMode == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nexact. value=",0xe);
    poVar4 = std::ostream::_M_insert<double>(local_540);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if (args->testMode == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"press <enter> to continue...",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::istream::get();
  }
  GMAA_MAAstarClassic::GMAA_MAAstarClassic
            (local_460,3,
             (DecPOMDPDiscreteInterface *)
             (&local_af0.super_DecPOMDPDiscrete + *(long *)(local_af0._0_8_ + -0x50)),local_1071,0);
  QFunctionJAOHTree::SetPU((PlanningUnitDecPOMDPDiscrete *)local_ff8);
  QFunctionJAOHTree::Compute();
  local_28 = local_ff8;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---------------------------------------",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-gmaa_maa3.Print()---------------------",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  PlanningUnitMADPDiscrete::Print();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-gmaa_maa.Plan()- QMDP - horizon=3----------------",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  GeneralizedMAAStarPlanner::Plan();
  if (args->testMode == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nexact. value=",0xe);
    poVar4 = std::ostream::_M_insert<double>(local_100);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  GeneralizedMAAStarPlanner::~GeneralizedMAAStarPlanner(local_128);
  PlanningUnitMADPDiscrete::~PlanningUnitMADPDiscrete((PlanningUnitMADPDiscrete *)local_460);
  GeneralizedMAAStarPlanner::~GeneralizedMAAStarPlanner(local_568);
  PlanningUnitMADPDiscrete::~PlanningUnitMADPDiscrete((PlanningUnitMADPDiscrete *)local_8a0);
  QBG::~QBG(local_ff8);
  QPOMDP::~QPOMDP(local_f98);
  QMDP::~QMDP((QMDP *)local_1068);
  GeneralizedMAAStarPlanner::~GeneralizedMAAStarPlanner(local_c00);
  PlanningUnitMADPDiscrete::~PlanningUnitMADPDiscrete((PlanningUnitMADPDiscrete *)local_f38);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_1071);
  DecPOMDPDiscrete::~DecPOMDPDiscrete(&local_af0.super_DecPOMDPDiscrete);
  return;
}

Assistant:

void TestGMAA(const ArgumentHandlers::Arguments& args)
{
    ProblemDecTiger pdt;
//    GeneralizedMAAStarPlanner gmaa(2, &pdt);

    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    GMAA_kGMAA gmaa_em(new BGIP_SolverCreator_AM<JointPolicyPureVector>(), 2, &pdt,&params);

    QMDP qmdp = QMDP(&gmaa_em);
    qmdp.Compute();
    gmaa_em.SetQHeuristic(&qmdp);
    
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_em.Print()---------------------"<<endl;
    gmaa_em.Print();

    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_em.Plan()- QMDP - horizon=2------"<<endl;
    gmaa_em.SetSeed(time(0));
    double V = -DBL_MAX;
    gmaa_em.Plan();
    V = gmaa_em.GetExpectedReward();
    if (!args.testMode)
        cout << "\napprox. value=" << V << endl;
    
    QPOMDP qpomdp = QPOMDP(&gmaa_em);
    qpomdp.Compute();
    gmaa_em.SetQHeuristic(&qpomdp);
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_em.Plan()- QPOMDP - horizon=2----"<<endl;
    gmaa_em.Plan();
    V = gmaa_em.GetExpectedReward();
    if (!args.testMode)
        cout << "\napprox. value="<< V << endl;

    QBG qbg = QBG(&gmaa_em);
    qbg.Compute();
    gmaa_em.SetQHeuristic(&qbg);
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_em.Plan()- QBG - horizon=2----"<<endl;
    gmaa_em.Plan();
    V = gmaa_em.GetExpectedReward();
    if (!args.testMode)
        cout << "\napprox. value="<< V << endl;
    
//    gmaa_em.ClearActionObservationHistories();
//    gmaa_em.ClearJointActionObservationHistories();       

    if (!args.testMode)
    {
        cout << "press <enter> to continue..."<<endl;
        cin.get();
    }
    
    GMAA_MAAstarClassic gmaa_maa(2, &pdt,&params);
//    bool calculateJointBeliefs = true;
//    gmaa_maa.CreateActionObservationHistories();
//    gmaa_maa.CreateJointActionObservationHistories(calculateJointBeliefs);    
//    QMDP qmdp = QMDP(gmaa_maa);
    qmdp.SetPU(&gmaa_maa);
    qmdp.Compute();
    gmaa_maa.SetQHeuristic(&qmdp);
    
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_maa.Print()---------------------"<<endl;
    gmaa_maa.Print();

    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_maa.Plan()- QMDP - horizon=2----------------"<<endl;
    gmaa_maa.SetSeed(time(0));
//    double V = -DBL_MAX;
    V = gmaa_maa.GetExpectedReward();
    if (!args.testMode)
        cout << "\nexact. value="<< V << endl;
//    gmaa_maa.ClearActionObservationHistories();
//    gmaa_maa.ClearJointActionObservationHistories();    

    if (!args.testMode)
    {
        cout << "press <enter> to continue..."<<endl;
        cin.get();
    }
//    gmaa_maa.SetHorizon(3);
//    gmaa_maa.SetInitialized(true);
    GMAA_MAAstarClassic gmaa_maa3(3, &pdt, &params);
//    gmaa_maa3.CreateActionObservationHistories();
//    gmaa_maa3.CreateJointActionObservationHistories(calculateJointBeliefs);    

    qbg.SetPU(&gmaa_maa3);
    qbg.Compute();
    gmaa_maa3.SetQHeuristic(qbg);    
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_maa3.Print()---------------------"<<endl;
    gmaa_maa3.Print();
    cout << "-gmaa_maa.Plan()- QMDP - horizon=3----------------"<<endl;
    gmaa_maa3.Plan();
    V = gmaa_maa3.GetExpectedReward();
    if (!args.testMode)
        cout << "\nexact. value="<< V << endl;
//    gmaa_maa3.ClearActionObservationHistories();
//    gmaa_maa3.ClearJointActionObservationHistories();    


    
    return;
}